

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O3

lua_State * luaL_newstate(void)

{
  lua_State *plVar1;
  
  plVar1 = lua_newstate((lua_Alloc)&DAT_00004d50,(void *)0x0);
  if (plVar1 != (lua_State *)0x0) {
    *(code **)((plVar1->glref).ptr64 + 0x160) = panic;
  }
  return plVar1;
}

Assistant:

LUALIB_API lua_State *luaL_newstate(void)
{
  lua_State *L;
#if LJ_64 && !LJ_GC64
  L = lj_state_newstate(LJ_ALLOCF_INTERNAL, NULL);
#else
  L = lua_newstate(LJ_ALLOCF_INTERNAL, NULL);
#endif
  if (L) G(L)->panic = panic;
  return L;
}